

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void concept_const_suite::iterator_swappable(void)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  initializer_list<int> __l;
  const_iterator b;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  basic_iterator<const_int> __tmp;
  basic_iterator<const_int> local_98;
  basic_iterator<const_int> local_88;
  vector<int,_std::allocator<int>_> local_70;
  circular_view<int,_18446744073709551615UL> local_58;
  iterator_type local_38 [2];
  
  local_58.member.data = (pointer)0x160000000b;
  local_58.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,(allocator_type *)&local_98);
  lVar3 = (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_58.member.data = (pointer)0x0;
  if (lVar3 != 0) {
    local_58.member.data =
         local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_58.member.cap = lVar3 >> 2;
  local_38[0].current = lVar3 >> 1;
  uVar2 = local_38[0].current - (local_38[0].current >> 1 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    local_98.current = local_38[0].current - 1 & local_58.member.cap;
  }
  else {
    local_98.current = local_58.member.cap % local_38[0].current;
  }
  local_88.current = 0;
  if ((byte)(uVar2 >> 0x38) < 2) {
    local_38[0].current = local_38[0].current - 1 & local_58.member.cap;
  }
  else {
    local_38[0].current = local_58.member.cap % local_38[0].current;
  }
  local_98.parent = &local_58;
  local_88.parent = &local_58;
  local_58.member.size = local_58.member.cap;
  local_58.member.next = local_58.member.cap;
  local_38[0].parent = &local_58;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    (&local_98,local_38);
  boost::detail::test_impl
            ("a == span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x15c,"void concept_const_suite::iterator_swappable()",bVar1);
  local_38[0].current = local_58.member.cap * 2;
  if ((local_38[0].current & local_58.member.cap * 2 - 1) == 0) {
    local_38[0].current = local_38[0].current - 1 & local_58.member.next - local_58.member.size;
  }
  else {
    local_38[0].current = (local_58.member.next - local_58.member.size) % local_38[0].current;
  }
  local_38[0].parent = &local_58;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    (&local_88,local_38);
  boost::detail::test_impl
            ("b == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x15d,"void concept_const_suite::iterator_swappable()",bVar1);
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void iterator_swappable()
{
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::const_iterator a = span.begin();
    circular_view<int>::const_iterator b = span.end();
    using std::swap;
    swap(a, b);
    BOOST_TEST(a == span.end());
    BOOST_TEST(b == span.begin());
}